

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall
args::ValueFlagList<int,_args::detail::vector,_args::ValueReader>::~ValueFlagList
          (ValueFlagList<int,_args::detail::vector,_args::ValueReader> *this)

{
  (this->super_ValueFlagBase).super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&PTR__ValueFlagList_00200fb8;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->defaultValues).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->values).super__Vector_base<int,_std::allocator<int>_>);
  FlagBase::~FlagBase((FlagBase *)this);
  return;
}

Assistant:

virtual ~ValueFlagList() {}